

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__tga_test(stbi__context *s)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  undefined4 local_1c;
  int sz;
  int res;
  stbi__context *s_local;
  
  stbi__get8(s);
  bVar1 = stbi__get8(s);
  if (bVar1 < 2) {
    sVar2 = stbi__get8(s);
    if (((((sVar2 == '\x01') || (sVar2 == '\x02')) || (sVar2 == '\x03')) ||
        ((sVar2 == '\t' || (sVar2 == '\n')))) || (sVar2 == '\v')) {
      stbi__get16be(s);
      stbi__get16be(s);
      stbi__get8(s);
      stbi__get16be(s);
      stbi__get16be(s);
      iVar3 = stbi__get16be(s);
      if (iVar3 < 1) {
        s_local._4_4_ = 0;
      }
      else {
        iVar3 = stbi__get16be(s);
        if (iVar3 < 1) {
          s_local._4_4_ = 0;
        }
        else {
          sVar2 = stbi__get8(s);
          if (((sVar2 == '\b') || (sVar2 == '\x10')) || ((sVar2 == '\x18' || (sVar2 == ' ')))) {
            local_1c = 1;
          }
          else {
            local_1c = 0;
          }
          stbi__rewind(s);
          s_local._4_4_ = local_1c;
        }
      }
    }
    else {
      s_local._4_4_ = 0;
    }
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__tga_test(stbi__context *s)
{
   int res;
   int sz;
   stbi__get8(s);      //   discard Offset
   sz = stbi__get8(s);   //   color type
   if ( sz > 1 ) return 0;   //   only RGB or indexed allowed
   sz = stbi__get8(s);   //   image type
   if ( (sz != 1) && (sz != 2) && (sz != 3) && (sz != 9) && (sz != 10) && (sz != 11) ) return 0;   //   only RGB or grey allowed, +/- RLE
   stbi__get16be(s);      //   discard palette start
   stbi__get16be(s);      //   discard palette length
   stbi__get8(s);         //   discard bits per palette color entry
   stbi__get16be(s);      //   discard x origin
   stbi__get16be(s);      //   discard y origin
   if ( stbi__get16be(s) < 1 ) return 0;      //   test width
   if ( stbi__get16be(s) < 1 ) return 0;      //   test height
   sz = stbi__get8(s);   //   bits per pixel
   if ( (sz != 8) && (sz != 16) && (sz != 24) && (sz != 32) )
      res = 0;
   else
      res = 1;
   stbi__rewind(s);
   return res;
}